

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O0

bool Utilities::parseNumber<int>(string *s,int *x)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  stringstream local_1c0 [8];
  stringstream ss;
  int local_38;
  int local_34;
  int n;
  int f;
  bool neg;
  char *pcStack_28;
  int r;
  char *p;
  int *x_local;
  string *s_local;
  
  pcStack_28 = (char *)std::__cxx11::string::c_str();
  f = 0;
  cVar1 = *pcStack_28;
  if (cVar1 == '-') {
    pcStack_28 = pcStack_28 + 1;
  }
  while( true ) {
    bVar2 = false;
    if ('/' < *pcStack_28) {
      bVar2 = *pcStack_28 < ':';
    }
    if (!bVar2) break;
    f = (int)((double)f * 10.0 + (double)(*pcStack_28 + -0x30));
    pcStack_28 = pcStack_28 + 1;
  }
  if (*pcStack_28 == '.') {
    local_34 = 0;
    local_38 = 0;
    while( true ) {
      pcStack_28 = pcStack_28 + 1;
      bVar2 = false;
      if ('/' < *pcStack_28) {
        bVar2 = *pcStack_28 < ':';
      }
      if (!bVar2) break;
      local_34 = (int)((double)local_34 * 10.0 + (double)(*pcStack_28 + -0x30));
      local_38 = local_38 + 1;
    }
    for (; 0 < local_38; local_38 = local_38 + -1) {
      local_34 = (int)((double)local_34 / 10.0);
    }
    f = local_34 + f;
  }
  if (cVar1 == '-') {
    f = -f;
  }
  *x = f;
  if (*pcStack_28 == '\0') {
    s_local._7_1_ = true;
  }
  else {
    _Var4 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_1c0,(string *)s,_Var4);
    std::istream::operator>>(local_1c0,x);
    bVar3 = std::ios::fail();
    s_local._7_1_ = (bool)((bVar3 ^ 0xff) & 1);
    std::__cxx11::stringstream::~stringstream(local_1c0);
  }
  return s_local._7_1_;
}

Assistant:

static bool parseNumber(const std::string& s, T &x)
    {
        const char* p = s.c_str();
        T r = 0.0;
        bool neg = false;
        if (*p == '-') {
            neg = true;
            ++p;
        }
        while (*p >= '0' && *p <= '9') {
            r = (r*10.0) + (*p - '0');
            ++p;
        }
        if (*p == '.') {
            T f = 0.0;
            int n = 0;
            ++p;
            while (*p >= '0' && *p <= '9') {
                f = (f*10.0) + (*p - '0');
                ++p;
                ++n;
            }

            while (n > 0)
            {
                f = f / 10.0;
                n--;
            }

            r += f;
        }
        if (neg) {
            r = -r;
        }

        x = r;

        if (*p == '\0')
            return true;

        // for some numbers in scientific notation 
        std::stringstream ss(s);
        ss >> x;
        return !ss.fail();
    }